

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O3

void Abc_SclFindWindow(Abc_Obj_t *pPivot,Vec_Int_t **pvNodes,Vec_Int_t **pvEvals)

{
  byte *pbVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  size_t __nmemb;
  long lVar10;
  long lVar11;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclDnsize.c"
                  ,0x34,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
  }
  pAVar3 = pPivot->pNtk;
  p = *pvNodes;
  p_00 = *pvEvals;
  p->nSize = 0;
  iVar9 = (pPivot->vFanins).nSize;
  if (0 < iVar9) {
    lVar10 = 0;
    do {
      pvVar4 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar10]];
      uVar8 = *(uint *)((long)pvVar4 + 0x14) & 0xf;
      if (((uVar8 == 2) || (uVar8 == 5)) || (0 < *(int *)((long)pvVar4 + 0x1c))) {
        Vec_IntPush(p,*(int *)((long)pvVar4 + 0x10));
        iVar9 = (pPivot->vFanins).nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9);
  }
  Vec_IntPush(p,pPivot->Id);
  if (0 < (pPivot->vFanouts).nSize) {
    lVar10 = 0;
    do {
      plVar5 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar10]];
      if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) {
        Vec_IntPush(p,(int)plVar5[2]);
        iVar9 = *(int *)((long)plVar5 + 0x2c);
        if (0 < iVar9) {
          lVar11 = 0;
          do {
            lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                             (long)*(int *)(plVar5[6] + lVar11 * 4) * 8);
            if ((*(uint *)(lVar6 + 0x14) & 0xf) == 7) {
              Vec_IntPush(p,*(int *)(lVar6 + 0x10));
              iVar9 = *(int *)((long)plVar5 + 0x2c);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (pPivot->vFanouts).nSize);
  }
  __nmemb = (size_t)p->nSize;
  if (1 < (long)__nmemb) {
    qsort(p->pArray,__nmemb,4,Vec_IntSortCompare1);
    iVar9 = p->nSize;
    __nmemb = 1;
    if (1 < iVar9) {
      piVar7 = p->pArray;
      __nmemb = 1;
      lVar10 = 1;
      do {
        if (piVar7[lVar10] != piVar7[lVar10 + -1]) {
          iVar9 = (int)__nmemb;
          __nmemb = (size_t)(iVar9 + 1);
          piVar7[iVar9] = piVar7[lVar10];
          iVar9 = p->nSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar9);
    }
    p->nSize = (int)__nmemb;
  }
  if (0 < (int)__nmemb) {
    lVar10 = 0;
    do {
      iVar9 = p->pArray[lVar10];
      if (((long)iVar9 < 0) || (pAVar3->vObjs->nSize <= iVar9)) goto LAB_0045ab18;
      pvVar4 = pAVar3->vObjs->pArray[iVar9];
      if (pvVar4 != (void *)0x0) {
        if ((*(uint *)((long)pvVar4 + 0x14) & 0x20) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclDnsize.c"
                        ,0x48,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
        }
        *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x20;
        __nmemb = (size_t)(uint)p->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)__nmemb);
  }
  p_00->nSize = 0;
  iVar9 = p->nSize;
  if (0 < iVar9) {
    lVar10 = 0;
    do {
      iVar2 = p->pArray[lVar10];
      if (((long)iVar2 < 0) || (pAVar3->vObjs->nSize <= iVar2)) goto LAB_0045ab18;
      plVar5 = (long *)pAVar3->vObjs->pArray[iVar2];
      if ((plVar5 != (long *)0x0) && (0 < (long)*(int *)((long)plVar5 + 0x2c))) {
        lVar11 = 0;
        do {
          if ((*(byte *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                  (long)*(int *)(plVar5[6] + lVar11 * 4) * 8) + 0x14) & 0x20) == 0)
          {
            if ((*(byte *)((long)plVar5 + 0x14) & 0x20) == 0) {
              __assert_fail("pObj->fMarkB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclDnsize.c"
                            ,0x51,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)")
              ;
            }
            Vec_IntPush(p_00,(int)plVar5[2]);
            iVar9 = p->nSize;
            break;
          }
          lVar11 = lVar11 + 1;
        } while (*(int *)((long)plVar5 + 0x2c) != lVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9);
    if (0 < p_00->nSize) {
      if (0 < iVar9) {
        lVar10 = 0;
        do {
          iVar2 = p->pArray[lVar10];
          if (((long)iVar2 < 0) || (pAVar3->vObjs->nSize <= iVar2)) {
LAB_0045ab18:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = pAVar3->vObjs->pArray[iVar2];
          if (pvVar4 != (void *)0x0) {
            pbVar1 = (byte *)((long)pvVar4 + 0x14);
            *pbVar1 = *pbVar1 & 0xdf;
            iVar9 = p->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar9);
      }
      return;
    }
  }
  __assert_fail("Vec_IntSize(vEvals) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclDnsize.c"
                ,0x55,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the array of nodes to be updated.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SclFindWindow( Abc_Obj_t * pPivot, Vec_Int_t ** pvNodes, Vec_Int_t ** pvEvals )
{
    Abc_Ntk_t * p = Abc_ObjNtk(pPivot);
    Abc_Obj_t * pObj, * pNext, * pNext2;
    Vec_Int_t * vNodes = *pvNodes;
    Vec_Int_t * vEvals = *pvEvals;
    int i, k;
    assert( Abc_ObjIsNode(pPivot) );
    // collect fanins, node, and fanouts
    Vec_IntClear( vNodes );
    Abc_ObjForEachFanin( pPivot, pNext, i )
//        if ( Abc_ObjIsNode(pNext) && Abc_ObjFaninNum(pNext) > 0 )
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) > 0 )
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
    Vec_IntPush( vNodes, Abc_ObjId(pPivot) );
    Abc_ObjForEachFanout( pPivot, pNext, i )
        if ( Abc_ObjIsNode(pNext) )
        {
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
            Abc_ObjForEachFanout( pNext, pNext2, k )
                if ( Abc_ObjIsNode(pNext2) )
                    Vec_IntPush( vNodes, Abc_ObjId(pNext2) );
        }
    Vec_IntUniqify( vNodes );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        pObj->fMarkB = 1;
    }
    // collect nodes visible from the critical paths
    Vec_IntClear( vEvals );
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( !pNext->fMarkB )
            {
                assert( pObj->fMarkB );
                Vec_IntPush( vEvals, Abc_ObjId(pObj) );
                break;
            }
    assert( Vec_IntSize(vEvals) > 0 );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->fMarkB = 0;
}